

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O2

void __thiscall Kumu::MemIOWriter::MemIOWriter(MemIOWriter *this,ByteString *Buf)

{
  ui32_t uVar1;
  byte_t *pbVar2;
  char *__assertion;
  
  this->m_p = (byte_t *)0x0;
  this->m_capacity = 0;
  this->m_size = 0;
  pbVar2 = ByteString::Data(Buf);
  this->m_p = pbVar2;
  uVar1 = Buf->m_Capacity;
  this->m_capacity = uVar1;
  if (pbVar2 == (byte_t *)0x0) {
    __assertion = "m_p";
  }
  else {
    if (uVar1 != 0) {
      return;
    }
    __assertion = "m_capacity";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                ,0x415,"Kumu::MemIOWriter::MemIOWriter(ByteString *)");
}

Assistant:

Kumu::MemIOWriter::MemIOWriter(ByteString* Buf)
  : m_p(0), m_capacity(0), m_size(0)
{
  m_p = Buf->Data();
  m_capacity = Buf->Capacity();
  assert(m_p); assert(m_capacity);
}